

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall
Js::ScriptContext::LeaveScriptStart<true,true>(ScriptContext *this,void *frameAddress)

{
  ThreadContext *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ThreadContext *threadContext;
  void *frameAddress_local;
  ScriptContext *this_local;
  
  this_00 = this->threadContext;
  bVar2 = ThreadContext::IsScriptActive(this_00);
  if (bVar2) {
    ThreadContext::ProbeStack(this_00,0x18000,this,(PVOID)0x0);
    ThreadContext::LeaveScriptStart<true>(this_00,frameAddress);
    this_local._7_1_ = true;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0xa95,"(0)","Leaving ScriptStart while script is not active.");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ScriptContext::LeaveScriptStart(void * frameAddress)
    {
        ThreadContext * threadContext = this->threadContext;
        if (!threadContext->IsScriptActive())
        {
            // we should have enter always.
            AssertMsg(FALSE, "Leaving ScriptStart while script is not active.");
            return false;
        }

        // Make sure the host function will have at least 32k of stack available.
        if (stackProbe)
        {
            threadContext->ProbeStack(Js::Constants::MinStackCallout, this);
        }
        else
        {
            AssertMsg(ExceptionCheck::HasStackProbe(), "missing stack probe");
        }

        threadContext->LeaveScriptStart<leaveForHost>(frameAddress);
        return true;
    }